

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void Adam7_getpassvalues(uint *passw,uint *passh,size_t *filter_passstart,size_t *padded_passstart,
                        size_t *passstart,uint w,uint h,uint bpp)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 4) {
    *(uint *)((long)passw + lVar3) =
         (~*(uint *)((long)ADAM7_IX + lVar3) + *(uint *)((long)ADAM7_DX + lVar3) + w) /
         *(uint *)((long)ADAM7_DX + lVar3);
    uVar1 = (~*(uint *)((long)ADAM7_IY + lVar3) + *(uint *)((long)ADAM7_DY + lVar3) + h) /
            *(uint *)((long)ADAM7_DY + lVar3);
    *(uint *)((long)passh + lVar3) = uVar1;
    if (*(int *)((long)passw + lVar3) == 0) {
      uVar1 = 0;
    }
    *(uint *)((long)passh + lVar3) = uVar1;
    if (uVar1 == 0) {
      *(undefined4 *)((long)passw + lVar3) = 0;
    }
  }
  *passstart = 0;
  *padded_passstart = 0;
  *filter_passstart = 0;
  for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 4) {
    if ((*(int *)((long)passw + lVar3) == 0) || (*(int *)((long)passh + lVar3) == 0)) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(*(int *)((long)passh + lVar3) *
                     ((*(int *)((long)passw + lVar3) * bpp + 7 >> 3) + 1));
    }
    *(ulong *)((long)filter_passstart + lVar3 * 2 + 8) =
         uVar2 + *(long *)((long)filter_passstart + lVar3 * 2);
    *(ulong *)((long)padded_passstart + lVar3 * 2 + 8) =
         (ulong)((*(int *)((long)passw + lVar3) * bpp + 7 >> 3) * *(int *)((long)passh + lVar3)) +
         *(long *)((long)padded_passstart + lVar3 * 2);
    *(ulong *)((long)passstart + lVar3 * 2 + 8) =
         (ulong)(*(int *)((long)passh + lVar3) * bpp * *(int *)((long)passw + lVar3) + 7 >> 3) +
         *(long *)((long)passstart + lVar3 * 2);
  }
  return;
}

Assistant:

static void Adam7_getpassvalues(unsigned passw[7], unsigned passh[7], size_t filter_passstart[8],
	size_t padded_passstart[8], size_t passstart[8], unsigned w, unsigned h, unsigned bpp)
{
	/*the passstart values have 8 values: the 8th one indicates the byte after the end of the 7th (= last) pass*/
	unsigned i;

	/*calculate width and height in pixels of each pass*/
	for (i = 0; i != 7; ++i)
	{
		passw[i] = (w + ADAM7_DX[i] - ADAM7_IX[i] - 1) / ADAM7_DX[i];
		passh[i] = (h + ADAM7_DY[i] - ADAM7_IY[i] - 1) / ADAM7_DY[i];
		if (passw[i] == 0) passh[i] = 0;
		if (passh[i] == 0) passw[i] = 0;
	}

	filter_passstart[0] = padded_passstart[0] = passstart[0] = 0;
	for (i = 0; i != 7; ++i)
	{
		/*if passw[i] is 0, it's 0 bytes, not 1 (no filtertype-byte)*/
		filter_passstart[i + 1] = filter_passstart[i]
			+ ((passw[i] && passh[i]) ? passh[i] * (1 + (passw[i] * bpp + 7) / 8) : 0);
		/*bits padded if needed to fill full byte at end of each scanline*/
		padded_passstart[i + 1] = padded_passstart[i] + passh[i] * ((passw[i] * bpp + 7) / 8);
		/*only padded at end of reduced image*/
		passstart[i + 1] = passstart[i] + (passh[i] * passw[i] * bpp + 7) / 8;
	}
}